

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_parser.c
# Opt level: O0

yajl_status yajl_do_finish(yajl_handle hand)

{
  yajl_status yVar1;
  uint uVar2;
  long in_RDI;
  yajl_status stat;
  size_t in_stack_00000068;
  uchar *in_stack_00000070;
  yajl_handle in_stack_00000078;
  
  yVar1 = yajl_do_parse(in_stack_00000078,in_stack_00000070,in_stack_00000068);
  if (yVar1 != yajl_status_ok) {
    return yVar1;
  }
  uVar2 = (uint)*(byte *)(*(long *)(in_RDI + 0x40) + -1 + *(long *)(in_RDI + 0x30));
  if (uVar2 != 1) {
    if (uVar2 - 2 < 2) {
      return yajl_status_error;
    }
    if (uVar2 != 0xc) {
      if ((*(uint *)(in_RDI + 0x70) & 0x10) == 0) {
        *(undefined1 *)(*(long *)(in_RDI + 0x30) + *(long *)(in_RDI + 0x40) + -1) = 2;
        *(char **)(in_RDI + 0x18) = "premature EOF";
        return yajl_status_error;
      }
      return yajl_status_ok;
    }
  }
  return yajl_status_ok;
}

Assistant:

yajl_status
yajl_do_finish(yajl_handle hand)
{
    yajl_status stat;
    stat = yajl_do_parse(hand,(const unsigned char *) " ",1);

    if (stat != yajl_status_ok) return stat;

    switch(yajl_bs_current(hand->stateStack))
    {
        case yajl_state_parse_error:
        case yajl_state_lexical_error:
            return yajl_status_error;
        case yajl_state_got_value:
        case yajl_state_parse_complete:
            return yajl_status_ok;
        default:
            if (!(hand->flags & yajl_allow_partial_values))
            {
                yajl_bs_set(hand->stateStack, yajl_state_parse_error);
                hand->parseError = "premature EOF";
                return yajl_status_error;
            }
            return yajl_status_ok;
    }
}